

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<kj::CidrRange>::setCapacity(Vector<kj::CidrRange> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::CidrRange> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<kj::CidrRange> newBuilder;
  size_t newSize_local;
  Vector<kj::CidrRange> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<kj::CidrRange>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::CidrRange>::truncate(&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<kj::CidrRange>
            ((ArrayBuilder<kj::CidrRange> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<kj::CidrRange>>(&this->builder);
  ArrayBuilder<kj::CidrRange>::addAll<kj::ArrayBuilder<kj::CidrRange>>
            ((ArrayBuilder<kj::CidrRange> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::CidrRange>>((ArrayBuilder<kj::CidrRange> *)local_38);
  ArrayBuilder<kj::CidrRange>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::CidrRange>::~ArrayBuilder((ArrayBuilder<kj::CidrRange> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }